

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void keyboardHandleKey(void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t time,
                      uint32_t scancode,uint32_t state)

{
  _GLFWwindow *window;
  int iVar1;
  uint action;
  int key;
  itimerspec timer;
  itimerspec local_48;
  
  window = _glfw.wl.keyboardFocus;
  if (_glfw.wl.keyboardFocus != (_GLFWwindow *)0x0) {
    key = -1;
    if (scancode < 0x100) {
      key = (int)_glfw.wl.keycodes[scancode];
    }
    local_48.it_value.tv_sec = 0;
    local_48.it_value.tv_nsec = 0;
    local_48.it_interval.tv_sec = 0;
    local_48.it_interval.tv_nsec = 0;
    action = (uint)(state == 1);
    _glfw.wl.serial = serial;
    if (state == 1) {
      iVar1 = (*_glfw.wl.xkb.keymap_key_repeats)(_glfw.wl.xkb.keymap,scancode + 8);
      if (0 < _glfw.wl.keyRepeatRate && iVar1 != 0) {
        if ((uint)_glfw.wl.keyRepeatRate < 2) {
          local_48.it_interval.tv_sec = 1;
        }
        else {
          local_48.it_interval.tv_nsec = 1000000000 / (ulong)(uint)_glfw.wl.keyRepeatRate;
        }
        local_48.it_value.tv_sec = (__time_t)(_glfw.wl.keyRepeatDelay / 1000);
        local_48.it_value.tv_nsec = (long)((_glfw.wl.keyRepeatDelay % 1000) * 1000000);
        _glfw.wl.keyRepeatScancode = scancode;
      }
      timerfd_settime(_glfw.wl.keyRepeatTimerfd,0,&local_48,(itimerspec *)0x0);
      _glfwInputKey(window,key,scancode,action,_glfw.wl.xkb.modifiers);
      inputText(window,scancode);
    }
    else {
      timerfd_settime(_glfw.wl.keyRepeatTimerfd,0,&local_48,(itimerspec *)0x0);
      _glfwInputKey(window,key,scancode,action,_glfw.wl.xkb.modifiers);
    }
  }
  return;
}

Assistant:

static void keyboardHandleKey(void* userData,
                              struct wl_keyboard* keyboard,
                              uint32_t serial,
                              uint32_t time,
                              uint32_t scancode,
                              uint32_t state)
{
    _GLFWwindow* window = _glfw.wl.keyboardFocus;
    if (!window)
        return;

    const int key = translateKey(scancode);
    const int action =
        state == WL_KEYBOARD_KEY_STATE_PRESSED ? GLFW_PRESS : GLFW_RELEASE;

    _glfw.wl.serial = serial;

    struct itimerspec timer = {0};

    if (action == GLFW_PRESS)
    {
        const xkb_keycode_t keycode = scancode + 8;

        if (xkb_keymap_key_repeats(_glfw.wl.xkb.keymap, keycode) &&
            _glfw.wl.keyRepeatRate > 0)
        {
            _glfw.wl.keyRepeatScancode = scancode;
            if (_glfw.wl.keyRepeatRate > 1)
                timer.it_interval.tv_nsec = 1000000000 / _glfw.wl.keyRepeatRate;
            else
                timer.it_interval.tv_sec = 1;

            timer.it_value.tv_sec = _glfw.wl.keyRepeatDelay / 1000;
            timer.it_value.tv_nsec = (_glfw.wl.keyRepeatDelay % 1000) * 1000000;
        }
    }

    timerfd_settime(_glfw.wl.keyRepeatTimerfd, 0, &timer, NULL);

    _glfwInputKey(window, key, scancode, action, _glfw.wl.xkb.modifiers);

    if (action == GLFW_PRESS)
        inputText(window, scancode);
}